

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::KdTreeAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,KdTreeAggregate *this,Ray *ray,
          Float rayTMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  KdTreeNode *pKVar5;
  optional<pbrt::ShapeIntersection> *this_00;
  bool bVar6;
  ShapeIntersection *pSVar7;
  uint uVar8;
  KdTreeNode *pKVar9;
  uint uVar10;
  int iVar11;
  Ray *pRVar12;
  Vector3f *pVVar13;
  long lVar14;
  Ray *pRVar15;
  Vector3f *d;
  KdTreeNode *pKVar16;
  KdTreeNode *pKVar17;
  long in_FS_OFFSET;
  float fVar18;
  float fVar19;
  Float tMax;
  Float tMin;
  optional<pbrt::ShapeIntersection> primSi;
  KdNodeToVisit toVisit [64];
  Float local_598;
  float local_594;
  float local_590;
  float local_58c;
  ulong local_588;
  optional<pbrt::ShapeIntersection> *local_580;
  float local_578;
  float local_574;
  KdTreeAggregate *local_570;
  Ray *local_568;
  Ray *local_560;
  Vector3f *local_558;
  Vector3f *local_550;
  Vector3f *local_548;
  optional<pbrt::ShapeIntersection> local_540;
  long lStack_438;
  float afStack_430 [256];
  
  d = &ray->d;
  bVar6 = Bounds3<float>::IntersectP(&this->bounds,&ray->o,d,rayTMax,&local_58c,&local_594);
  if (!bVar6) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  local_574 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  local_590 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  local_548 = (Vector3f *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  pRVar15 = (Ray *)&(ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  iVar11 = 0;
  local_588 = 0;
  local_550 = (Vector3f *)&(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_568 = (Ray *)&(ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  local_578 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  __return_storage_ptr__->set = false;
  pKVar16 = this->nodes;
  local_580 = __return_storage_ptr__;
  local_560 = pRVar15;
  do {
    pKVar5 = this->nodes;
    fVar18 = local_594;
    while( true ) {
      if ((pKVar16 == (KdTreeNode *)0x0) || (rayTMax < local_58c)) goto LAB_00401677;
      uVar4 = (pKVar16->field_1).flags;
      uVar10 = uVar4 & 3;
      uVar8 = (int)uVar4 >> 2;
      if (uVar10 == 3) break;
      pRVar12 = ray;
      fVar19 = local_590;
      if ((uVar10 != 0) && (pRVar12 = pRVar15, fVar19 = local_574, uVar10 != 1)) {
        pRVar12 = local_568;
        fVar19 = local_578;
      }
      fVar1 = (pKVar16->field_0).split;
      fVar2 = (pRVar12->o).super_Tuple3<pbrt::Point3,_float>.x;
      if (fVar2 < fVar1) {
LAB_00401451:
        pKVar16 = pKVar16 + 1;
        pKVar9 = pKVar5 + (int)uVar8;
      }
      else {
        pRVar12 = ray;
        if ((uVar10 != 0) && (pRVar12 = pRVar15, uVar10 != 1)) {
          pRVar12 = local_568;
        }
        fVar3 = (pRVar12->o).super_Tuple3<pbrt::Point3,_float>.x;
        if ((fVar3 == fVar1) && (!NAN(fVar3) && !NAN(fVar1))) {
          pVVar13 = d;
          if ((uVar10 != 0) && (pVVar13 = local_548, uVar10 != 1)) {
            pVVar13 = local_550;
          }
          if ((pVVar13->super_Tuple3<pbrt::Vector3,_float>).x <= 0.0) goto LAB_00401451;
        }
        pKVar9 = pKVar16 + 1;
        pKVar16 = pKVar5 + (int)uVar8;
      }
      fVar19 = (1.0 / fVar19) * (fVar1 - fVar2);
      pKVar17 = pKVar16;
      if (((fVar19 <= 0.0) || (fVar18 < fVar19)) || (pKVar17 = pKVar9, fVar19 < local_58c)) {
        iVar11 = iVar11 + 1;
        pKVar16 = pKVar17;
      }
      else {
        iVar11 = iVar11 + 1;
        lVar14 = (long)(int)local_588;
        local_588 = (ulong)((int)local_588 + 1);
        (&lStack_438)[lVar14 * 2] = (long)pKVar9;
        afStack_430[lVar14 * 4] = fVar19;
        afStack_430[lVar14 * 4 + 1] = fVar18;
        fVar18 = fVar19;
        local_594 = fVar19;
      }
    }
    if (uVar8 == 1) {
      PrimitiveHandle::Intersect
                (&local_540,
                 (this->primitives).
                 super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
                 _M_impl.super__Vector_impl_data._M_start + (pKVar16->field_0).onePrimitive,ray,
                 rayTMax);
      local_598 = rayTMax;
      if (local_540.set == true) {
        pstd::optional<pbrt::ShapeIntersection>::operator=(__return_storage_ptr__,&local_540);
        pSVar7 = pstd::optional<pbrt::ShapeIntersection>::value(__return_storage_ptr__);
        local_598 = pSVar7->tHit;
      }
      pstd::optional<pbrt::ShapeIntersection>::~optional(&local_540);
      pRVar15 = local_560;
      rayTMax = local_598;
    }
    else {
      local_570 = this;
      local_558 = d;
      for (lVar14 = 0; __return_storage_ptr__ = local_580, d = local_558, this = local_570,
          (~((int)uVar4 >> 0x1f) & uVar8) != (uint)lVar14; lVar14 = lVar14 + 1) {
        PrimitiveHandle::Intersect
                  (&local_540,
                   (local_570->primitives).
                   super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (local_570->primitiveIndices).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start
                   [(pKVar16->field_0).onePrimitive + lVar14],ray,rayTMax);
        this_00 = local_580;
        local_598 = rayTMax;
        if (local_540.set == true) {
          pstd::optional<pbrt::ShapeIntersection>::operator=(local_580,&local_540);
          pSVar7 = pstd::optional<pbrt::ShapeIntersection>::value(this_00);
          local_598 = pSVar7->tHit;
        }
        pstd::optional<pbrt::ShapeIntersection>::~optional(&local_540);
        pRVar15 = local_560;
        rayTMax = local_598;
      }
    }
    iVar11 = iVar11 + 1;
    if ((int)local_588 < 1) {
LAB_00401677:
      *(long *)(in_FS_OFFSET + -800) = *(long *)(in_FS_OFFSET + -800) + (long)iVar11;
      return __return_storage_ptr__;
    }
    local_588 = (ulong)((int)local_588 - 1);
    local_58c = afStack_430[local_588 * 4];
    local_594 = afStack_430[local_588 * 4 + 1];
    pKVar16 = (KdTreeNode *)(&lStack_438)[local_588 * 2];
  } while( true );
}

Assistant:

pstd::optional<ShapeIntersection> KdTreeAggregate::Intersect(const Ray &ray,
                                                             Float rayTMax) const {
    // Compute initial parametric range of ray inside kd-tree extent
    Float tMin, tMax;
    if (!bounds.IntersectP(ray.o, ray.d, rayTMax, &tMin, &tMax))
        return {};

    // Prepare to traverse kd-tree for ray
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    constexpr int maxToVisit = 64;
    KdNodeToVisit toVisit[maxToVisit];
    int toVisitIndex = 0;
    int nodesVisited = 0;

    // Traverse kd-tree nodes in order for ray
    pstd::optional<ShapeIntersection> si;
    const KdTreeNode *node = &nodes[0];
    while (node != nullptr) {
        // Bail out if we found a hit closer than the current node
        if (rayTMax < tMin)
            break;

        ++nodesVisited;
        if (!node->IsLeaf()) {
            // Visit kd-tree interior node
            // Compute parametric distance along ray to split plane
            int axis = node->SplitAxis();
            Float tSplit = (node->SplitPos() - ray.o[axis]) * invDir[axis];

            // Get node children pointers for ray
            const KdTreeNode *firstChild, *secondChild;
            int belowFirst = (ray.o[axis] < node->SplitPos()) ||
                             (ray.o[axis] == node->SplitPos() && ray.d[axis] <= 0);
            if (belowFirst) {
                firstChild = node + 1;
                secondChild = &nodes[node->AboveChild()];
            } else {
                firstChild = &nodes[node->AboveChild()];
                secondChild = node + 1;
            }

            // Advance to next child node, possibly enqueue other child
            if (tSplit > tMax || tSplit <= 0)
                node = firstChild;
            else if (tSplit < tMin)
                node = secondChild;
            else {
                // Enqueue _secondChild_ in todo list
                toVisit[toVisitIndex].node = secondChild;
                toVisit[toVisitIndex].tMin = tSplit;
                toVisit[toVisitIndex].tMax = tMax;
                ++toVisitIndex;

                node = firstChild;
                tMax = tSplit;
            }

        } else {
            // Check for intersections inside leaf node
            int nPrimitives = node->nPrimitives();
            if (nPrimitives == 1) {
                const PrimitiveHandle &p = primitives[node->onePrimitive];
                // Check one primitive inside leaf node
                pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                if (primSi) {
                    si = primSi;
                    rayTMax = si->tHit;
                }

            } else {
                for (int i = 0; i < nPrimitives; ++i) {
                    int index = primitiveIndices[node->primitiveIndicesOffset + i];
                    const PrimitiveHandle &p = primitives[index];
                    // Check one primitive inside leaf node
                    pstd::optional<ShapeIntersection> primSi = p.Intersect(ray, rayTMax);
                    if (primSi) {
                        si = primSi;
                        rayTMax = si->tHit;
                    }
                }
            }

            // Grab next node to visit from todo list
            if (toVisitIndex > 0) {
                --toVisitIndex;
                node = toVisit[toVisitIndex].node;
                tMin = toVisit[toVisitIndex].tMin;
                tMax = toVisit[toVisitIndex].tMax;
            } else
                break;
        }
    }
    kdNodesVisited += nodesVisited;
    return si;
}